

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O2

void reverse(void)

{
  uint8_t *puVar1;
  uint16_t uVar2;
  bool bVar3;
  int iVar4;
  Rgba RVar5;
  uint uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined4 extraout_var;
  streambuf *psVar9;
  long lVar10;
  reference pvVar11;
  undefined4 extraout_var_00;
  png_structp ppVar12;
  png_infop ppVar13;
  ulong uVar14;
  int *piVar15;
  char *pcVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  iterator __begin2;
  long lVar20;
  char cVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  array<unsigned_char,_16UL> *paVar26;
  uint8_t y;
  byte bVar27;
  uchar *attr;
  undefined8 uVar28;
  byte bVar29;
  ulong uVar30;
  initializer_list<std::array<Rgba,_4UL>_> __l;
  allocator_type local_301;
  ulong local_300;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> palettes;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  tilemap;
  uint8_t *rowPtrs [8];
  png_infop pngInfo;
  png_structp png;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  attrmap;
  DefaultInitVec<uint8_t> tiles;
  png_color_8 sbitChunk;
  optional<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  palmap;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tileRow;
  path local_1c8;
  path local_1a0;
  path local_178;
  File pngFile;
  path local_58;
  
  uVar7 = png_get_libpng_ver(0);
  Options::verbosePrint(&options,'\x01',"Using libpng %s\n",uVar7);
  if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == false) {
    fatal("Tile data must be provided when reversing an image!");
  }
  if ((options.allowDedup == true) &&
     (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == false)) {
    warning("Tile deduplication is enabled, but no tilemap is provided?");
  }
  if (options.useColorCurve == true) {
    warning("The color curve is not yet supported in reverse mode...");
  }
  if (((options.inputSlice.left != 0) || (options.inputSlice.top != 0)) ||
     (options.inputSlice.height != 0)) {
    warning("\"Sliced-off\" pixels are ignored in reverse mode");
  }
  if ((options.inputSlice.width != 0) &&
     ((uint)options.reversedWidth * 8 != (uint)options.inputSlice.width)) {
    warning("Specified input slice width (%u) doesn\'t match provided reversing width (%u * 8)");
  }
  Options::verbosePrint(&options,'\x02',"Reading tiles...\n");
  std::filesystem::__cxx11::path::path(&local_58,(path *)&options.output);
  readInto(&tiles,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  uVar23 = (long)tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = (ulong)(byte)(options.bitDepth << 3);
  if (uVar23 % uVar18 != 0) {
    fatal("Tile data size (%zu bytes) is not a multiple of %u bytes",uVar23,uVar18);
  }
  uVar23 = uVar23 / uVar18 + options.trim;
  Options::verbosePrint(&options,'\x03',"Read %zu tiles.\n",uVar23);
  tilemap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_178,(path *)&options.tilemap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_178);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&tilemap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    std::
    _Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~_Vector_base((_Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&pngFile);
    std::filesystem::__cxx11::path::~path(&local_178);
    uVar23 = (long)tilemap.
                   super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._0_8_;
    Options::verbosePrint(&options,'\x03',"Read %zu tilemap entries.\n",uVar23);
  }
  if (uVar23 == 0) {
    fatal("Cannot generate empty image");
  }
  if ((ulong)options.maxNbTiles._M_elems[1] + (ulong)options.maxNbTiles._M_elems[0] < uVar23) {
    warning("Read %zu tiles, more than the limit of %zu + %zu",uVar23);
  }
  uVar30 = (ulong)options.reversedWidth;
  uVar8 = uVar23 / uVar30;
  if (uVar23 % uVar30 != 0) {
    fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",uVar23,
          uVar30);
  }
  Options::verbosePrint(&options,'\x03',"Reversed image dimensions: %zux%zu tiles\n",uVar30,uVar8);
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0xffffffff;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0xffaaaaaa;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._8_4_ =
       0xff555555;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._12_4_
       = 0xff000000;
  __l._M_len = 1;
  __l._M_array = (iterator)&pngFile;
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::vector
            (&palettes,__l,(allocator_type *)rowPtrs);
  local_300 = uVar23;
  if (options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
      .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    pngFile._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_
         = 0;
    pngFile._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_
         = 0;
    pngFile._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
         '\0';
    iVar4 = File::open(&pngFile,(char *)&options.palettes,0xc);
    if (CONCAT44(extraout_var,iVar4) == 0) {
      File::string((string *)rowPtrs,&pngFile,(path *)&options.palettes);
      piVar15 = __errno_location();
      pcVar16 = strerror(*piVar15);
      fatal("Failed to open \"%s\": %s",rowPtrs[0],pcVar16);
    }
    if (palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      palettes.super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           palettes.
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    while( true ) {
      psVar9 = File::operator*(&pngFile);
      lVar10 = (**(code **)(*(long *)psVar9 + 0x40))(psVar9,rowPtrs,8);
      if (lVar10 != 8) break;
      pvVar11 = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
                emplace_back<>(&palettes);
      uVar23 = (ulong)options.nbColorsPerPal;
      lVar10 = (long)rowPtrs + 1;
      for (lVar20 = 0; uVar23 * 4 != lVar20; lVar20 = lVar20 + 4) {
        RVar5 = Rgba::fromCGBColor(*(uint16_t *)(lVar10 + -1));
        *(Rgba *)(&pvVar11->_M_elems[0].red + lVar20) = RVar5;
        lVar10 = lVar10 + 2;
      }
    }
    if (lVar10 != 0) {
      fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
            ((long)palettes.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)palettes.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 1) + lVar10,8);
    }
    if ((ulong)options.nbPalettes <
        (ulong)((long)palettes.
                      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)palettes.
                      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      warning("Read %zu palettes, more than the specified limit of %zu");
    }
    if ((options.palSpecType == EXPLICIT) &&
       (bVar3 = std::operator==(&palettes,&options.palSpec), !bVar3)) {
      warning("Colors in the palette file do not match those specified with `-c`!");
    }
    File::~File(&pngFile);
  }
  else if (options.palSpecType == EXPLICIT) {
    std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::_M_move_assign
              (&palettes,0x121420);
  }
  else if (options.palSpecType == EMBEDDED) {
    warning(
           "An embedded palette was requested, but no palette file was specified; ignoring request."
           );
  }
  attrmap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_1a0,(path *)&options.attrmap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_1a0);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&attrmap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    std::
    _Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~_Vector_base((_Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&pngFile);
    std::filesystem::__cxx11::path::~path(&local_1a0);
    if ((long)attrmap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_payload._M_value.
              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._0_8_ != local_300) {
      fatal("Attribute map size (%zu tiles) doesn\'t match image\'s (%zu)",
            (long)attrmap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            attrmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._0_8_,local_300);
    }
    bVar3 = false;
    for (uVar7 = attrmap.
                 super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_payload._M_value.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (pointer)uVar7 !=
        attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._M_value.
        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; uVar7 = uVar7 + 1) {
      bVar29 = *(byte *)uVar7;
      if ((ulong)((long)palettes.
                        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)palettes.
                        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) < (ulong)(bVar29 & 7)) {
        bVar3 = true;
        error("Referencing palette %u, but there are only %zu!");
      }
      if (((bVar29 & 8) != 0) &&
         (tilemap.
          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_engaged == false)) {
        warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
      }
    }
    if (bVar3) {
      giveUp();
    }
  }
  if (tilemap.
      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_engaged == true) {
    uVar7 = tilemap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    uVar28 = attrmap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (attrmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_engaged == true) {
      for (; (pointer)uVar7 !=
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; uVar7 = (byte *)(uVar7 + 1)) {
        uVar6 = *(byte *)uVar28 >> 3 & 1;
        if (options.maxNbTiles._M_elems[uVar6] <= (ushort)*(byte *)uVar7) {
          warning("Tile #%u was referenced, but the limit for bank %u is %u",(ulong)*(byte *)uVar7,
                  (ulong)(byte)uVar6);
        }
        uVar28 = (byte *)(uVar28 + 1);
      }
    }
    else {
      for (; (pointer)uVar7 !=
             tilemap.
             super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; uVar7 = (byte *)(uVar7 + 1)) {
        if (options.maxNbTiles._M_elems[0] <= *(byte *)uVar7) {
          warning("Tile #%u was referenced, but the limit is %u",(ulong)*(byte *)uVar7);
        }
      }
    }
  }
  uVar23 = local_300;
  palmap.
  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_engaged = false;
  if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
    std::filesystem::__cxx11::path::path(&local_1c8,(path *)&options.palmap);
    readInto((DefaultInitVec<uint8_t> *)&pngFile,&local_1c8);
    std::
    optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
    ::operator=((optional<std::vector<unsigned_char,default_init_allocator<unsigned_char,std::allocator<unsigned_char>>>>
                 *)&palmap,
                (vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&pngFile);
    std::
    _Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~_Vector_base((_Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&pngFile);
    std::filesystem::__cxx11::path::~path(&local_1c8);
    if ((long)palmap.
              super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_payload._M_value.
              super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        palmap.
        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_payload._0_8_ != uVar23) {
      fatal("Palette map size (%zu tiles) doesn\'t match image\'s (%zu)",
            (long)palmap.
                  super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            palmap.
            super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_payload._0_8_,uVar23);
    }
  }
  Options::verbosePrint(&options,'\x02',"Writing image...\n");
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._0_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u._4_4_ =
       0;
  pngFile._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
       '\0';
  iVar4 = File::open(&pngFile,(char *)&options.input,0x14);
  if (CONCAT44(extraout_var_00,iVar4) == 0) {
    File::string((string *)rowPtrs,&pngFile,(path *)&options.input);
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Failed to create \"%s\": %s",rowPtrs[0],pcVar16);
  }
  File::string((string *)rowPtrs,&pngFile,(path *)&options.input);
  ppVar12 = (png_structp)png_create_write_struct("1.6.37",rowPtrs[0],pngError,pngWarning);
  std::__cxx11::string::~string((string *)rowPtrs);
  png = ppVar12;
  if (ppVar12 == (png_structp)0x0) {
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Couldn\'t create PNG write struct: %s",pcVar16);
  }
  ppVar13 = (png_infop)png_create_info_struct(ppVar12);
  pngInfo = ppVar13;
  if (ppVar13 == (png_infop)0x0) {
    piVar15 = __errno_location();
    pcVar16 = strerror(*piVar15);
    fatal("Couldn\'t create PNG info struct: %s",pcVar16);
  }
  png_set_write_fn(ppVar12,&pngFile,writePng,flushPng);
  png_set_IHDR(ppVar12,ppVar13,(ulong)options.reversedWidth << 3,(int)uVar8 * 8,8,6,0,0,0);
  png_write_info(ppVar12,ppVar13);
  png_set_sBIT(ppVar12,ppVar13);
  uVar2 = options.reversedWidth;
  uVar23 = (ulong)options.reversedWidth;
  rowPtrs[0] = (uint8_t *)CONCAT71(rowPtrs[0]._1_7_,0xff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&tileRow,(ulong)options.reversedWidth << 8,(value_type_conflict *)rowPtrs,&local_301);
  rowPtrs[0] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  rowPtrs[1] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar2 * 0x20;
  rowPtrs[2] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar2 * 0x40;
  rowPtrs[3] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23 * 0x60;
  rowPtrs[4] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (ulong)uVar2 * 0x80;
  rowPtrs[5] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23 * 0xa0;
  rowPtrs[6] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23 * 0xc0;
  rowPtrs[7] = tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23 * 0xe0;
  uVar23 = 0;
  do {
    if (uVar8 <= uVar23) {
      png_write_end(ppVar12,ppVar13);
      iVar4 = (int)&pngInfo;
      png_destroy_write_struct(&png);
      File::close(&pngFile,iVar4);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tileRow.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      File::~File(&pngFile);
      std::
      _Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_reset((_Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&palmap);
      std::
      _Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_reset((_Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&attrmap);
      std::_Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
      ~_Vector_base(&palettes.
                     super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   );
      std::
      _Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::_M_reset((_Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&tilemap);
      std::
      _Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~_Vector_base(&tiles.
                       super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     );
      return;
    }
    lVar10 = 0;
    for (uVar24 = 0; uVar24 != uVar30; uVar24 = uVar24 + 1) {
      uVar14 = uVar23 * uVar30 + uVar24;
      if (options.columnMajor != false) {
        uVar14 = uVar24 * uVar30 + uVar23;
      }
      uVar25 = 0;
      if (attrmap.
          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_engaged == true) {
        uVar25 = (ulong)attrmap.
                        super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar14];
      }
      uVar19 = uVar14;
      if (tilemap.
          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_engaged == true) {
        uVar6 = (uint)(uVar25 >> 3) & 1;
        uVar19 = (ulong)(int)(options.maxNbTiles._M_elems[0] * uVar6 +
                             ((uint)tilemap.
                                    super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ._M_payload._M_value.
                                    super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar14] -
                             (uint)options.baseTileIDs._M_elems[uVar6]));
      }
      if (local_300 <= uVar19) {
        __assert_fail("tileID < nbTileInstances",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                      ,0x125,"reverse");
      }
      if (palmap.
          super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_engaged == true) {
        uVar6 = (uint)palmap.
                      super__Optional_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14];
      }
      else {
        uVar6 = (uint)uVar25 & 7;
      }
      if ((ulong)((long)palettes.
                        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)palettes.
                        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= (ulong)uVar6) {
        __assert_fail("palID < palettes.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/reverse.cpp"
                      ,0x127,"reverse");
      }
      paVar26 = (array<unsigned_char,_16UL> *)
                (tiles.
                 super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19 * uVar18);
      if (local_300 - options.trim < uVar19) {
        paVar26 = &reverse::trimmedTile;
      }
      uVar6 = uVar6 << 4;
      for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
        cVar21 = (char)lVar20;
        if ((uVar25 & 0x40) != 0) {
          cVar21 = '\a' - (char)lVar20;
        }
        bVar29 = paVar26->_M_elems[(byte)(options.bitDepth * cVar21)];
        bVar27 = paVar26->_M_elems
                 [(ulong)(options.bitDepth != '\x01') + (ulong)(byte)(options.bitDepth * cVar21)];
        if ((uVar25 & 0x20) != 0) {
          bVar29 = flipTable._M_elems[bVar29];
          bVar27 = flipTable._M_elems[bVar27];
        }
        puVar1 = rowPtrs[lVar20];
        for (lVar22 = 0; (char)lVar22 != '\b'; lVar22 = lVar22 + 1) {
          bVar17 = bVar27 >> 6 & 2 | bVar29 >> 7;
          puVar1[lVar22 * 4 + lVar10] =
               (&(palettes.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].red)[uVar6];
          puVar1[lVar22 * 4 + lVar10 + 1] =
               (&(palettes.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].green)[uVar6];
          puVar1[lVar22 * 4 + lVar10 + 2] =
               (&(palettes.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].blue)[uVar6];
          puVar1[lVar22 * 4 + lVar10 + 3] =
               (&(palettes.
                  super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[bVar17].alpha)[uVar6];
          bVar29 = bVar29 * '\x02';
          bVar27 = bVar27 * '\x02';
        }
      }
      lVar10 = lVar10 + 0x20;
    }
    png_write_rows(ppVar12,rowPtrs,8);
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

void reverse() {
	options.verbosePrint(Options::VERB_CFG, "Using libpng %s\n", png_get_libpng_ver(nullptr));

	// Check for weird flag combinations

	if (!options.output.has_value()) {
		fatal("Tile data must be provided when reversing an image!");
	}

	if (options.allowDedup && !options.tilemap.has_value()) {
		warning("Tile deduplication is enabled, but no tilemap is provided?");
	}

	if (options.useColorCurve) {
		warning("The color curve is not yet supported in reverse mode...");
	}

	if (options.inputSlice.left != 0 || options.inputSlice.top != 0
	    || options.inputSlice.height != 0) {
		warning("\"Sliced-off\" pixels are ignored in reverse mode");
	}
	if (options.inputSlice.width != 0 && options.inputSlice.width != options.reversedWidth * 8) {
		warning("Specified input slice width (%" PRIu16
		        ") doesn't match provided reversing width (%" PRIu8 " * 8)",
		        options.inputSlice.width, options.reversedWidth);
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Reading tiles...\n");
	auto const tiles = readInto(*options.output);
	uint8_t tileSize = 8 * options.bitDepth;
	if (tiles.size() % tileSize != 0) {
		fatal("Tile data size (%zu bytes) is not a multiple of %" PRIu8 " bytes",
		      tiles.size(), tileSize);
	}

	// By default, assume tiles are not deduplicated, and add the (allegedly) trimmed tiles
	size_t nbTileInstances = tiles.size() / tileSize + options.trim; // Image size in tiles
	options.verbosePrint(Options::VERB_INTERM, "Read %zu tiles.\n", nbTileInstances);
	std::optional<DefaultInitVec<uint8_t>> tilemap;
	if (options.tilemap.has_value()) {
		tilemap = readInto(*options.tilemap);
		nbTileInstances = tilemap->size();
		options.verbosePrint(Options::VERB_INTERM, "Read %zu tilemap entries.\n", nbTileInstances);
	}

	if (nbTileInstances == 0) {
		fatal("Cannot generate empty image");
	}
	if (nbTileInstances > options.maxNbTiles[0] + options.maxNbTiles[1]) {
		warning("Read %zu tiles, more than the limit of %zu + %zu", nbTileInstances,
		        options.maxNbTiles[0], options.maxNbTiles[1]);
	}

	size_t width = options.reversedWidth, height; // In tiles
	if (nbTileInstances % width != 0) {
		fatal("Total number of tiles read (%zu) cannot be divided by image width (%zu tiles)",
		      nbTileInstances, width);
	}
	height = nbTileInstances / width;

	options.verbosePrint(Options::VERB_INTERM, "Reversed image dimensions: %zux%zu tiles\n", width,
	                     height);

	// TODO: -U

	std::vector<std::array<Rgba, 4>> palettes{
	    {Rgba(0xFFFFFFFF), Rgba(0xAAAAAAFF), Rgba(0x555555FF), Rgba(0x000000FF)}
	};
	// If a palette file is used as input, it overrides the default colours.
	if (options.palettes.has_value()) {
		File file;
		if (!file.open(*options.palettes, std::ios::in | std::ios::binary)) {
			fatal("Failed to open \"%s\": %s", file.string(*options.palettes).c_str(),
			      strerror(errno));
		}

		palettes.clear();
		std::array<uint8_t, sizeof(uint16_t) * 4> buf; // 4 colors
		size_t nbRead;
		do {
			nbRead = file->sgetn(reinterpret_cast<char *>(buf.data()), buf.size());
			if (nbRead == buf.size()) {
				// Expand the colors
				auto &palette = palettes.emplace_back();
				std::generate(palette.begin(), palette.begin() + options.nbColorsPerPal,
				              [&buf, i = 0]() mutable {
					              i += 2;
					              return Rgba::fromCGBColor(buf[i - 2] + (buf[i - 1] << 8));
				              });
			} else if (nbRead != 0) {
				fatal("Palette data size (%zu) is not a multiple of %zu bytes!\n",
				      palettes.size() * buf.size() + nbRead, buf.size());
			}
		} while (nbRead != 0);

		if (palettes.size() > options.nbPalettes) {
			warning("Read %zu palettes, more than the specified limit of %zu", palettes.size(),
			        options.nbPalettes);
		}

		if (options.palSpecType == Options::EXPLICIT && palettes != options.palSpec) {
			warning("Colors in the palette file do not match those specified with `-c`!");
		}
	} else if (options.palSpecType == Options::EMBEDDED) {
		warning("An embedded palette was requested, but no palette file was specified; ignoring request.");
	} else if (options.palSpecType == Options::EXPLICIT) {
		palettes = std::move(options.palSpec); // We won't be using it again.
	}

	std::optional<DefaultInitVec<uint8_t>> attrmap;
	if (options.attrmap.has_value()) {
		attrmap = readInto(*options.attrmap);
		if (attrmap->size() != nbTileInstances) {
			fatal("Attribute map size (%zu tiles) doesn't match image's (%zu)", attrmap->size(),
			      nbTileInstances);
		}

		// Scan through the attributes for inconsistencies
		// We do this now for two reasons:
		// 1. Checking those during the main loop is harmful to optimization, and
		// 2. It clutters the code more, and it's not in great shape to begin with
		bool bad = false;
		for (auto attr : *attrmap) {
			if ((attr & 0b111) > palettes.size()) {
				error("Referencing palette %u, but there are only %zu!");
				bad = true;
			}
			if (attr & 0x08 && !tilemap) {
				warning("Tile in bank 1 but no tilemap specified; ignoring the bank bit");
			}
		}
		if (bad) {
			giveUp();
		}
	}

	if (tilemap) {
		if (attrmap) {
			for (auto [id, attr] : zip(*tilemap, *attrmap)) {
				bool bank = attr & 1 << 3;
				if (id >= options.maxNbTiles[bank]) {
					warning("Tile #%" PRIu8
					        " was referenced, but the limit for bank %u is %" PRIu16,
					        id, bank, options.maxNbTiles[bank]);
				}
			}
		} else {
			for (auto id : *tilemap) {
				if (id >= options.maxNbTiles[0]) {
					warning("Tile #%" PRIu8 " was referenced, but the limit is %" PRIu16, id,
					        options.maxNbTiles[0]);
				}
			}
		}
	}

	std::optional<DefaultInitVec<uint8_t>> palmap;
	if (options.palmap.has_value()) {
		palmap = readInto(*options.palmap);
		if (palmap->size() != nbTileInstances) {
			fatal("Palette map size (%zu tiles) doesn't match image's (%zu)", palmap->size(),
			      nbTileInstances);
		}
	}

	options.verbosePrint(Options::VERB_LOG_ACT, "Writing image...\n");
	File pngFile;
	if (!pngFile.open(*options.input, std::ios::out | std::ios::binary)) {
		fatal("Failed to create \"%s\": %s", pngFile.string(*options.input).c_str(),
		      strerror(errno));
	}
	png_structp png = png_create_write_struct(
	    PNG_LIBPNG_VER_STRING,
	    const_cast<png_voidp>(static_cast<void const *>(pngFile.string(*options.input).c_str())),
	    pngError, pngWarning);
	if (!png) {
		fatal("Couldn't create PNG write struct: %s", strerror(errno));
	}
	png_infop pngInfo = png_create_info_struct(png);
	if (!pngInfo) {
		fatal("Couldn't create PNG info struct: %s", strerror(errno));
	}
	png_set_write_fn(png, &pngFile, writePng, flushPng);

	png_set_IHDR(png, pngInfo, options.reversedWidth * 8, height * 8, 8, PNG_COLOR_TYPE_RGB_ALPHA,
	             PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);
	png_write_info(png, pngInfo);

	png_color_8 sbitChunk;
	sbitChunk.red = 5;
	sbitChunk.green = 5;
	sbitChunk.blue = 5;
	sbitChunk.alpha = 1;
	png_set_sBIT(png, pngInfo, &sbitChunk);

	constexpr uint8_t SIZEOF_PIXEL = 4; // Each pixel is 4 bytes (RGBA @ 8 bits/component)
	size_t const SIZEOF_ROW = options.reversedWidth * 8 * SIZEOF_PIXEL;
	std::vector<uint8_t> tileRow(8 * SIZEOF_ROW, 0xFF); // Data for 8 rows of pixels
	uint8_t * const rowPtrs[8] = {
	    &tileRow.data()[0 * SIZEOF_ROW], &tileRow.data()[1 * SIZEOF_ROW],
	    &tileRow.data()[2 * SIZEOF_ROW], &tileRow.data()[3 * SIZEOF_ROW],
	    &tileRow.data()[4 * SIZEOF_ROW], &tileRow.data()[5 * SIZEOF_ROW],
	    &tileRow.data()[6 * SIZEOF_ROW], &tileRow.data()[7 * SIZEOF_ROW],
	};

	for (size_t ty = 0; ty < height; ++ty) {
		for (size_t tx = 0; tx < width; ++tx) {
			size_t index = options.columnMajor ? ty + tx * width : ty * width + tx;
			// By default, a tile is unflipped, in bank 0, and uses palette #0
			uint8_t attribute = attrmap.has_value() ? (*attrmap)[index] : 0x00;
			bool bank = attribute & 0x08;
			// Get the tile ID at this location
			size_t tileID = index;
			if (tilemap.has_value()) {
				tileID =
				    (*tilemap)[index] - options.baseTileIDs[bank] + bank * options.maxNbTiles[0];
			}
			assert(tileID < nbTileInstances); // Should have been checked earlier
			size_t palID = palmap ? (*palmap)[index] : attribute & 0b111;
			assert(palID < palettes.size()); // Should be ensured on data read

			// We do not have data for tiles trimmed with `-x`, so assume they are "blank"
			static std::array<uint8_t, 16> const trimmedTile{
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			    0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
			};
			uint8_t const *tileData = tileID > nbTileInstances - options.trim
			                              ? trimmedTile.data()
			                              : &tiles[tileID * tileSize];
			auto const &palette = palettes[palID];
			for (uint8_t y = 0; y < 8; ++y) {
				// If vertically mirrored, fetch the bytes from the other end
				uint8_t realY = (attribute & 0x40 ? 7 - y : y) * options.bitDepth;
				uint8_t bitplane0 = tileData[realY];
				uint8_t bitplane1 = tileData[realY + 1 % options.bitDepth];
				if (attribute & 0x20) { // Handle horizontal flip
					bitplane0 = flipTable[bitplane0];
					bitplane1 = flipTable[bitplane1];
				}
				uint8_t *ptr = &rowPtrs[y][tx * 8 * SIZEOF_PIXEL];
				for (uint8_t x = 0; x < 8; ++x) {
					uint8_t bit0 = bitplane0 & 0x80, bit1 = bitplane1 & 0x80;
					Rgba const &pixel = palette[bit0 >> 7 | bit1 >> 6];
					*ptr++ = pixel.red;
					*ptr++ = pixel.green;
					*ptr++ = pixel.blue;
					*ptr++ = pixel.alpha;

					// Shift the pixel out
					bitplane0 <<= 1;
					bitplane1 <<= 1;
				}
			}
		}
		// We never modify the pointers, and neither should libpng, despite the overly lax function
		// signature.
		// (AIUI, casting away const-ness is okay as long as you don't actually modify the
		// pointed-to data)
		png_write_rows(png, const_cast<png_bytepp>(rowPtrs), 8);
	}

	// Finalize the write
	png_write_end(png, pngInfo);

	png_destroy_write_struct(&png, &pngInfo);
	pngFile.close();
}